

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O0

void Opal_Sample(Opal *self,int16_t *left,int16_t *right)

{
  int32_t iVar1;
  int32_t fract;
  int16_t *right_local;
  int16_t *left_local;
  Opal *self_local;
  
  while (self->SampleRate <= self->SampleAccum) {
    self->LastOutput[0] = self->CurrOutput[0];
    self->LastOutput[1] = self->CurrOutput[1];
    Opal_Output(self,self->CurrOutput,self->CurrOutput + 1);
    self->SampleAccum = self->SampleAccum - self->SampleRate;
  }
  iVar1 = s_opal_MulDivR(self->SampleAccum,0x10000,self->SampleRate);
  *left = self->LastOutput[0] +
          (short)((iVar1 * ((int)self->CurrOutput[0] - (int)self->LastOutput[0])) / 0x10000);
  *right = self->LastOutput[1] +
           (short)((iVar1 * ((int)self->CurrOutput[1] - (int)self->LastOutput[1])) / 0x10000);
  self->SampleAccum = self->SampleAccum + 0xc234;
  return;
}

Assistant:

void Opal_Sample(Opal *self, int16_t* left, int16_t* right)
{
    int32_t fract;

    /* If the destination sample rate is higher than the OPL3 sample rate, we need to skip ahead */
    while(self->SampleAccum >= self->SampleRate)
    {
        self->LastOutput[0] = self->CurrOutput[0];
        self->LastOutput[1] = self->CurrOutput[1];

        Opal_Output(self, &self->CurrOutput[0], &self->CurrOutput[1]);

        self->SampleAccum -= self->SampleRate;
    }

    /* Mix with the partial accumulation */
    fract = s_opal_MulDivR(self->SampleAccum, 65536, self->SampleRate);
    *left = (int16_t)(self->LastOutput[0] + ((fract * (self->CurrOutput[0] - self->LastOutput[0])) / 65536));
    *right = (int16_t)(self->LastOutput[1] + ((fract * (self->CurrOutput[1] - self->LastOutput[1])) / 65536));

    self->SampleAccum += OpalOPL3SampleRate;
}